

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChakraCoreShared.cpp
# Opt level: O2

BOOL DllMain(HINSTANCE hmod,DWORD dwReason,PVOID pvReserved)

{
  if (dwReason == 1) {
    OnChakraCoreLoaded((OnChakraCoreLoadedPtr)0x0);
  }
  return 1;
}

Assistant:

__attribute__ ((visibility ("default")))
EXTERN_C BOOL WINAPI DllMain(HINSTANCE hmod, DWORD dwReason, PVOID pvReserved)
{
    // xplat doesn't need DllMain is being called.
    // Instead, we handle attach / detach stuff internally. (see lib/Jsrt/JsrtHelper.cpp)
    // However, PAL/ch will end-up calling here in order to enable TestFlags tooling
#ifdef ENABLE_TEST_HOOKS
    if (dwReason == DLL_PROCESS_ATTACH) OnChakraCoreLoaded();
#endif
    return TRUE;
}